

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

void mxx::all2allv<int>(int *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
                       int *out,vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,
                       comm *comm)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  impl::get_displacements<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,send_sizes);
  impl::get_displacements<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,recv_sizes);
  all2allv<int>(msgs,send_sizes,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,
                out,recv_sizes,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,
                comm);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void all2allv(const T* msgs, const std::vector<size_t>& send_sizes, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
#if MXX_CHAR_ALL2ALL_ALIGN
    size_t total_send_size = std::accumulate(send_sizes.begin(), send_sizes.end(), static_cast<size_t>(0));
    bool use_align = mxx::any_of(total_send_size/comm.size() >= 100, comm);
    if (sizeof(T) == 1 && use_align) {
        // align before sending
        char_all2allv(msgs, send_sizes, out, recv_sizes, comm);
    } else {
#endif
        // get displacements
        std::vector<size_t> send_displs = impl::get_displacements(send_sizes);
        std::vector<size_t> recv_displs = impl::get_displacements(recv_sizes);
        // call more specialized all2allv
        all2allv(msgs, send_sizes, send_displs, out, recv_sizes, recv_displs, comm);
#if MXX_CHAR_ALL2ALL_ALIGN
    }
#endif
}


/**
 * @brief   All-to-all message exchange between all processes in the communicator.
 *
 * This overload returns a `std::vector` with the received data, instead of
 * writing into an output pointer `out`.
 *
 * @see all2allv()
 *
 * @tparam T        The data type of the elements.
 * @param msgs      Pointer to memory containing the elements to be send.
 * @param send_sizes    A `std::vector` of size `comm.size()`, this contains
 *                      the number of elements to be send to each of the processes.
 * @param recv_sizes    A `std::vector` of size `comm.size()`, this contains
 *                      the number of elements to be received from each process.
 * @param comm      The communicator (`comm.hpp`). Defaults to `world`.
 *
 * @returns     The received messages as a `std::vector`.
 */
template <typename T>
std::vector<T> all2allv(const T* msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    size_t recv_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), static_cast<size_t>(0));
    std::vector<T> result(recv_size);
    all2allv(msgs, send_sizes, &result[0], recv_sizes, comm);
    return result;
}

/**
 * @brief   All-to-all message exchange between all processes in the communicator.
 *
 * This overload takes a `std::vector` as input and returns
 *  a `std::vector` with the received data, instead of
 * writing into an output pointer `out`.
 *
 * @see all2allv()
 *
 * @tparam T        The data type of the elements.
 * @param msgs      `std::vector` containing the elements to be send.
 * @param send_sizes    A `std::vector` of size `comm.size()`, this contains
 *                      the number of elements to be send to each of the processes.
 * @param recv_sizes    A `std::vector` of size `comm.size()`, this contains
 *                      the number of elements to be received from each process.
 * @param comm      The communicator (`comm.hpp`). Defaults to `world`.
 *
 * @returns     The received messages as a `std::vector`.
 */
template <typename T>
std::vector<T> all2allv(const std::vector<T>& msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(msgs.size() == std::accumulate(send_sizes.begin(), send_sizes.end(), static_cast<size_t>(0)));
    return all2allv(&msgs[0], send_sizes, recv_sizes, comm);
}

// unknown receive size:
/**
 * @brief   All-to-all message exchange between all processes in the communicator.
 *
 * This function assumes that the `recv_sizes` are not known prior to executing
 * an `all2allv()`. Hence, this function first communicates the number of elements
 * send to each process, prior to executing a `all2allv()`.
 *
 * This overload takes a `std::vector` as input.
 *
 * @see all2allv()
 *
 * @tparam T        The data type of the elements.
 * @param msgs      Pointer to memory containing the elements to be send.
 * @param send_sizes    A `std::vector` of size `comm.size()`, this contains
 *                      the number of elements to be send to each of the processes.
 * @param comm      The communicator (`comm.hpp`). Defaults to `world`.
 *
 * @returns     The received messages as a `std::vector`.
 */
template <typename T>
std::vector<T> all2allv(const T* msgs, const std::vector<size_t>& send_sizes, const mxx::comm& comm = mxx::comm()) {
    // first get recv sizes
    MXX_ASSERT(send_sizes.size() == static_cast<size_t>(comm.size()));
    std::vector<size_t> recv_sizes = all2all(send_sizes, comm);
    return all2allv(msgs, send_sizes, recv_sizes, comm);
}

/**
 * @brief   All-to-all message exchange between all processes in the communicator.
 *
 * This function assumes that the `recv_sizes` are not known prior to executing
 * an `all2allv()`. Hence, this function first communicates the number of elements
 * send to each process, prior to executing a `all2allv()`.
 *
 * This overload takes a `std::vector` as input.
 *
 * @see all2allv()
 *
 * @tparam T        The data type of the elements.
 * @param msgs      `std::vector` containing the elements to be send.
 * @param send_sizes    A `std::vector` of size `comm.size()`, this contains
 *                      the number of elements to be send to each of the processes.
 * @param comm      The communicator (`comm.hpp`). Defaults to `world`.
 *
 * @returns     The received messages as a `std::vector`.
 */
template <typename T>
std::vector<T> all2allv(const std::vector<T>& msgs, const std::vector<size_t>& send_sizes, const mxx::comm& comm = mxx::comm()) {
    return all2allv(&msgs[0], send_sizes, comm);
}

// TODO: add tests and documentation
// inplace (input vec == output vec)
// TODO: distinguish explicitly between inplace and not
template <typename T, typename Func>
void all2all_func(std::vector<T>& msgs, Func target_func, const mxx::comm& comm = mxx::comm()) {
    // bucket input by their target processor
    // TODO: in-place bucketing!
    // TODO: replace with bucketing function, implemented elsewhere
    std::vector<size_t> send_counts(comm.size(), 0);
    for (auto it = msgs.begin(); it != msgs.end(); ++it) {
        assert(0 <= target_func(*it) && target_func(*it) < comm.size());
        send_counts[target_func(*it)]++;
    }
    std::vector<std::size_t> offset = impl::get_displacements(send_counts);
    std::vector<T> send_buffer;
    if (msgs.size() > 0) {
        send_buffer.resize(msgs.size());
    }
    for (auto it = msgs.begin(); it != msgs.end(); ++it) {
        send_buffer[offset[target_func(*it)]++] = *it;
    }

    // get receive counts
    std::vector<size_t> recv_counts = all2all(send_counts, comm);

    // resize messages to fit recv
    std::size_t recv_size = std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0));
    msgs.clear();
    msgs.shrink_to_fit();
    msgs.resize(recv_size);

    // all2all
    all2allv(&send_buffer[0], send_counts, &msgs[0], recv_counts, comm);
    // done, result is returned in vector of input messages
}

}